

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
GeneratedMessageReflection_UnvalidatedStringsAreDowngradedToBytes_Test::TestBody
          (GeneratedMessageReflection_UnvalidatedStringsAreDowngradedToBytes_Test *this)

{
  TestAllExtensions *pTVar1;
  TestAllExtensions *other;
  Message *in_RCX;
  string_view input;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_90 [8];
  TestChildExtension msg;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined1 local_40 [8];
  TestChildExtension parsed_msg;
  GeneratedMessageReflection_UnvalidatedStringsAreDowngradedToBytes_Test *this_local;
  
  parsed_msg.field_0._impl_.optional_extension_ = (TestAllExtensions *)this;
  proto2_unittest::TestChildExtension::TestChildExtension((TestChildExtension *)local_40);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,
             "\n        optional_extension <\n          [proto2_unittest.repeated_string_extension]: \"foo\"\n        >\n      "
            );
  input._M_str = (char *)local_40;
  input._M_len = (size_t)local_50._M_str;
  TextFormat::ParseFromString((TextFormat *)local_50._M_len,input,in_RCX);
  proto2_unittest::TestChildExtension::TestChildExtension((TestChildExtension *)local_90);
  pTVar1 = proto2_unittest::TestChildExtension::mutable_optional_extension
                     ((TestChildExtension *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"bar",&local_b1);
  proto2_unittest::TestAllExtensions::
  AddExtension<google::protobuf::internal::RepeatedStringTypeTraits,(unsigned_char)12,false>
            (pTVar1,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedStringTypeTraits,_(unsigned_char)__f_,_false>
                     *)proto2_unittest::repeated_string_extension,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  pTVar1 = proto2_unittest::TestChildExtension::mutable_optional_extension
                     ((TestChildExtension *)local_40);
  other = proto2_unittest::TestChildExtension::mutable_optional_extension
                    ((TestChildExtension *)local_90);
  proto2_unittest::TestAllExtensions::Swap(pTVar1,other);
  proto2_unittest::TestChildExtension::~TestChildExtension((TestChildExtension *)local_90);
  proto2_unittest::TestChildExtension::~TestChildExtension((TestChildExtension *)local_40);
  return;
}

Assistant:

TEST(GeneratedMessageReflection, UnvalidatedStringsAreDowngradedToBytes) {
  proto2_unittest::TestChildExtension parsed_msg;
  google::protobuf::TextFormat::ParseFromString(
      R"pb(
        optional_extension <
          [proto2_unittest.repeated_string_extension]: "foo"
        >
      )pb",
      &parsed_msg);
  proto2_unittest::TestChildExtension msg;
  msg.mutable_optional_extension()->AddExtension(
      proto2_unittest::repeated_string_extension, "bar");
  parsed_msg.mutable_optional_extension()->Swap(
      msg.mutable_optional_extension());
}